

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

char * luna::Value::TypeName(ValueT type)

{
  ValueT type_local;
  char *local_8;
  
  switch(type) {
  case ValueT_Nil:
    local_8 = "nil";
    break;
  case ValueT_Bool:
    local_8 = "bool";
    break;
  case ValueT_Number:
    local_8 = "number";
    break;
  default:
    local_8 = "unknown type";
    break;
  case ValueT_String:
    local_8 = "string";
    break;
  case ValueT_Closure:
    local_8 = "function";
    break;
  case ValueT_Upvalue:
    local_8 = "upvalue";
    break;
  case ValueT_Table:
    local_8 = "table";
    break;
  case ValueT_UserData:
    local_8 = "userdata";
    break;
  case ValueT_CFunction:
    local_8 = "C-Function";
  }
  return local_8;
}

Assistant:

const char * Value::TypeName(ValueT type)
    {
        switch (type)
        {
            case ValueT_Nil: return "nil";
            case ValueT_Bool: return "bool";
            case ValueT_Number: return "number";
            case ValueT_CFunction: return "C-Function";
            case ValueT_String: return "string";
            case ValueT_Closure: return "function";
            case ValueT_Upvalue: return "upvalue";
            case ValueT_Table: return "table";
            case ValueT_UserData: return "userdata";
            default: return "unknown type";
        }
    }